

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall flatbuffers::Parser::ParseHexNum(Parser *this,int nibbles,uint64_t *val)

{
  bool bVar1;
  uint64_t uVar2;
  uint64_t *in_RCX;
  undefined4 in_register_00000034;
  string *psVar3;
  ulong uVar4;
  ulong uVar5;
  string target;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  psVar3 = (string *)CONCAT44(in_register_00000034,nibbles);
  if ((int)val < 1) {
    __assert_fail("nibbles > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                  ,0x1c8,"CheckedError flatbuffers::Parser::ParseHexNum(int, uint64_t *)");
  }
  uVar4 = (ulong)val & 0xffffffff;
  uVar5 = 0;
  do {
    if (uVar4 == uVar5) {
      target._M_dataplus._M_p = (pointer)&target.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&target,psVar3->_M_string_length,psVar3->_M_string_length + uVar4);
      uVar2 = StringToUInt(target._M_dataplus._M_p,0x10);
      *in_RCX = uVar2;
      psVar3->_M_string_length = psVar3->_M_string_length + uVar4;
      *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
      psVar3 = &target;
      goto LAB_00104e57;
    }
    bVar1 = is_xdigit(*(char *)(psVar3->_M_string_length + uVar5));
    uVar5 = uVar5 + 1;
  } while (bVar1);
  NumToString<int>(&local_50,(int)val);
  std::operator+(&local_70,"escape code must be followed by ",&local_50);
  std::operator+(&target,&local_70," hex digits");
  Error(this,psVar3);
  std::__cxx11::string::~string((string *)&target);
  std::__cxx11::string::~string((string *)&local_70);
  psVar3 = &local_50;
LAB_00104e57:
  std::__cxx11::string::~string((string *)psVar3);
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseHexNum(int nibbles, uint64_t *val) {
  FLATBUFFERS_ASSERT(nibbles > 0);
  for (int i = 0; i < nibbles; i++)
    if (!is_xdigit(cursor_[i]))
      return Error("escape code must be followed by " + NumToString(nibbles) +
                   " hex digits");
  std::string target(cursor_, cursor_ + nibbles);
  *val = StringToUInt(target.c_str(), 16);
  cursor_ += nibbles;
  return NoError();
}